

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O0

void cmime_address_set_name(CMimeAddress_T *ca,char *name)

{
  char *pcVar1;
  char *name_local;
  CMimeAddress_T *ca_local;
  
  if (ca == (CMimeAddress_T *)0x0) {
    __assert_fail("ca",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_address.c"
                  ,0x29,"void cmime_address_set_name(CMimeAddress_T *, const char *)");
  }
  if (name != (char *)0x0) {
    if (ca->name != (char *)0x0) {
      free(ca->name);
    }
    pcVar1 = strdup(name);
    ca->name = pcVar1;
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_address.c"
                ,0x2a,"void cmime_address_set_name(CMimeAddress_T *, const char *)");
}

Assistant:

void cmime_address_set_name(CMimeAddress_T *ca, const char *name) {
    assert(ca);
    assert(name);
    
    if (ca->name != NULL)
        free(ca->name);
        
    ca->name = strdup(name);
}